

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

void __thiscall
cmCTest::OutputTestErrors(cmCTest *this,vector<char,_std::allocator<char>_> *process_output)

{
  bool bVar1;
  reference pcVar2;
  ostream *this_00;
  void *this_01;
  char *msg;
  string local_1f0 [32];
  undefined1 local_1d0 [8];
  ostringstream cmCTestLog_msg;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_58 [3];
  allocator local_39;
  string local_38 [8];
  string test_outputs;
  vector<char,_std::allocator<char>_> *process_output_local;
  cmCTest *this_local;
  
  test_outputs.field_2._8_8_ = process_output;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"\n*** Test Failed:\n",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  bVar1 = std::vector<char,_std::allocator<char>_>::empty
                    ((vector<char,_std::allocator<char>_> *)test_outputs.field_2._8_8_);
  if (!bVar1) {
    local_58[0]._M_current =
         (char *)std::vector<char,_std::allocator<char>_>::begin
                           ((vector<char,_std::allocator<char>_> *)test_outputs.field_2._8_8_);
    pcVar2 = __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
             operator*(local_58);
    std::vector<char,_std::allocator<char>_>::size
              ((vector<char,_std::allocator<char>_> *)test_outputs.field_2._8_8_);
    std::__cxx11::string::append((char *)local_38,(ulong)pcVar2);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
  this_00 = std::operator<<((ostream *)local_1d0,local_38);
  this_01 = (void *)std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(this_01,std::flush<char,std::char_traits<char>>);
  std::__cxx11::ostringstream::str();
  msg = (char *)std::__cxx11::string::c_str();
  Log(this,2,
      "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
      ,0xcdb,msg,false);
  std::__cxx11::string::~string(local_1f0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void cmCTest::OutputTestErrors(std::vector<char> const &process_output)
{
  std::string test_outputs("\n*** Test Failed:\n");
  if(!process_output.empty())
    {
    test_outputs.append(&*process_output.begin(), process_output.size());
    }
  cmCTestLog(this, HANDLER_OUTPUT, test_outputs << std::endl << std::flush);
}